

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlRelaxNGStatesPtr xmlRelaxNGNewStates(xmlRelaxNGValidCtxtPtr ctxt,int size)

{
  xmlRelaxNGStatesPtr pxVar1;
  xmlRelaxNGValidStatePtr *ppxVar2;
  uint uVar3;
  
  if ((ctxt->freeStates == (xmlRelaxNGStatesPtr *)0x0) || (ctxt->freeStatesNr < 1)) {
    uVar3 = 0x10;
    if (0x10 < size) {
      uVar3 = size;
    }
    pxVar1 = (xmlRelaxNGStatesPtr)(*xmlMalloc)((ulong)(uVar3 - 1) * 8 + 0x10);
    if (pxVar1 == (xmlRelaxNGStatesPtr)0x0) {
      xmlRngVErrMemory(ctxt,"allocating states\n");
    }
    else {
      pxVar1->nbState = 0;
      pxVar1->maxState = uVar3;
      ppxVar2 = (xmlRelaxNGValidStatePtr *)(*xmlMalloc)((ulong)uVar3 << 3);
      pxVar1->tabState = ppxVar2;
      if (ppxVar2 != (xmlRelaxNGValidStatePtr *)0x0) {
        return pxVar1;
      }
      xmlRngVErrMemory(ctxt,"allocating states\n");
      (*xmlFree)(pxVar1);
    }
    pxVar1 = (xmlRelaxNGStatesPtr)0x0;
  }
  else {
    uVar3 = ctxt->freeStatesNr - 1;
    ctxt->freeStatesNr = uVar3;
    pxVar1 = ctxt->freeStates[uVar3];
    pxVar1->nbState = 0;
  }
  return pxVar1;
}

Assistant:

static xmlRelaxNGStatesPtr
xmlRelaxNGNewStates(xmlRelaxNGValidCtxtPtr ctxt, int size)
{
    xmlRelaxNGStatesPtr ret;

    if ((ctxt != NULL) &&
        (ctxt->freeStates != NULL) && (ctxt->freeStatesNr > 0)) {
        ctxt->freeStatesNr--;
        ret = ctxt->freeStates[ctxt->freeStatesNr];
        ret->nbState = 0;
        return (ret);
    }
    if (size < 16)
        size = 16;

    ret = (xmlRelaxNGStatesPtr) xmlMalloc(sizeof(xmlRelaxNGStates) +
                                          (size -
                                           1) *
                                          sizeof(xmlRelaxNGValidStatePtr));
    if (ret == NULL) {
        xmlRngVErrMemory(ctxt, "allocating states\n");
        return (NULL);
    }
    ret->nbState = 0;
    ret->maxState = size;
    ret->tabState = (xmlRelaxNGValidStatePtr *) xmlMalloc((size) *
                                                          sizeof
                                                          (xmlRelaxNGValidStatePtr));
    if (ret->tabState == NULL) {
        xmlRngVErrMemory(ctxt, "allocating states\n");
        xmlFree(ret);
        return (NULL);
    }
    return (ret);
}